

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  ImGuiContext *pIVar1;
  size_t sVar2;
  ImVector<char> *this;
  char *pcVar3;
  char *in_RSI;
  char *text_end;
  ImGuiContext *g;
  ImVector<char> *in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  ImVector<char>::clear(in_stack_ffffffffffffffe0);
  sVar2 = strlen(in_RSI);
  this = (ImVector<char> *)(in_RSI + sVar2);
  ImVector<char>::resize(this,(int)((ulong)in_RSI >> 0x20));
  pcVar3 = ImVector<char>::operator[](&pIVar1->PrivateClipboard,0);
  memcpy(pcVar3,in_RSI,(long)this - (long)in_RSI);
  pcVar3 = ImVector<char>::operator[](&pIVar1->PrivateClipboard,(int)this - (int)in_RSI);
  *pcVar3 = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}